

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonObjectVector<cfd::js::api::json::UtxoObject,_cfd::js::api::UtxoObjectStruct>::
ConvertFromStruct(JsonObjectVector<cfd::js::api::json::UtxoObject,_cfd::js::api::UtxoObjectStruct>
                  *this,vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
                        *list)

{
  bool bVar1;
  undefined1 local_1c0 [8];
  UtxoObject object;
  UtxoObjectStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_> *__range3;
  vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
  *list_local;
  JsonObjectVector<cfd::js::api::json::UtxoObject,_cfd::js::api::UtxoObjectStruct> *this_local;
  
  __end0 = std::
           vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>::
           begin(list);
  element = (UtxoObjectStruct *)
            std::
            vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
            ::end(list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_cfd::js::api::UtxoObjectStruct_*,_std::vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>_>
                                *)&element);
    if (!bVar1) break;
    object._384_8_ =
         __gnu_cxx::
         __normal_iterator<const_cfd::js::api::UtxoObjectStruct_*,_std::vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>_>
         ::operator*(&__end0);
    js::api::json::UtxoObject::UtxoObject((UtxoObject *)local_1c0);
    js::api::json::UtxoObject::ConvertFromStruct
              ((UtxoObject *)local_1c0,(UtxoObjectStruct *)object._384_8_);
    std::vector<cfd::js::api::json::UtxoObject,_std::allocator<cfd::js::api::json::UtxoObject>_>::
    push_back(&(this->super_JsonVector<cfd::js::api::json::UtxoObject>).
               super_vector<cfd::js::api::json::UtxoObject,_std::allocator<cfd::js::api::json::UtxoObject>_>
              ,(value_type *)local_1c0);
    js::api::json::UtxoObject::~UtxoObject((UtxoObject *)local_1c0);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::UtxoObjectStruct_*,_std::vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }